

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationDriveline::ArchiveOUT
          (ChLinkMotorRotationDriveline *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChShaft>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMotorRotationDriveline>(marchive);
  ChLinkMotorRotation::ArchiveOUT(&this->super_ChLinkMotorRotation,marchive);
  local_38._value = (shared_ptr<chrono::ChShaft> *)&(this->super_ChLinkMotorRotation).field_0x278;
  local_38._name = "innershaft1";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChShaft>(marchive,&local_38);
  local_38._value = &this->innershaft2;
  local_38._name = "innershaft2";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChShaft>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChShaft> *)&this->innerconstraint1;
  local_38._name = "innerconstraint1";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChShaftsBody>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaftsBody>_> *)&local_38);
  local_38._value = (shared_ptr<chrono::ChShaft> *)&this->innerconstraint2;
  local_38._name = "innerconstraint2";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChShaftsBody>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaftsBody>_> *)&local_38);
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMotorRotationDriveline>();

    // serialize parent class
    ChLinkMotorRotation::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(innershaft1);
    marchive << CHNVP(innershaft2);
    marchive << CHNVP(innerconstraint1);
    marchive << CHNVP(innerconstraint2);
}